

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint32 ma_dr_mp3_decode_next_frame_ex(ma_dr_mp3 *pMP3,ma_dr_mp3d_sample_t *pPCMFrames)

{
  size_t *psVar1;
  byte bVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  ma_uint8 *pmVar7;
  long lVar8;
  uint uVar9;
  ma_dr_mp3dec_frame_info info;
  ma_dr_mp3dec_frame_info local_44;
  
  pmVar7 = (pMP3->memory).pData;
  if ((pmVar7 == (ma_uint8 *)0x0) || (sVar6 = (pMP3->memory).dataSize, sVar6 == 0)) {
    uVar9 = 0;
    if ((pMP3->field_0x3ea0 & 1) == 0) {
      uVar9 = 0;
      do {
        if (pMP3->dataSize < 0x4000) {
          pmVar7 = pMP3->pData;
          if (pmVar7 != (ma_uint8 *)0x0) {
            memmove(pmVar7,pmVar7 + pMP3->dataConsumed,pMP3->dataSize);
          }
          pMP3->dataConsumed = 0;
          if (0xffff < pMP3->dataCapacity) {
LAB_0015c764:
            sVar6 = (*pMP3->onRead)(pMP3->pUserData,pMP3->pData + pMP3->dataSize,
                                    pMP3->dataCapacity - pMP3->dataSize);
            pMP3->streamCursor = pMP3->streamCursor + sVar6;
            if ((sVar6 != 0) || (pMP3->dataSize != 0)) {
              pMP3->dataSize = pMP3->dataSize + sVar6;
              goto LAB_0015c7a9;
            }
            goto LAB_0015c7b9;
          }
          pmVar7 = (ma_uint8 *)
                   ma_dr_mp3__realloc_from_callbacks
                             (pMP3->pData,0x10000,pMP3->dataCapacity,&pMP3->allocationCallbacks);
          if (pmVar7 != (ma_uint8 *)0x0) {
            pMP3->pData = pmVar7;
            pMP3->dataCapacity = 0x10000;
            goto LAB_0015c764;
          }
LAB_0015c7c0:
          iVar4 = 1;
        }
        else {
LAB_0015c7a9:
          if ((pMP3->dataSize & 0xffffffff80000000) != 0) {
LAB_0015c7b9:
            pMP3->field_0x3ea0 = pMP3->field_0x3ea0 | 1;
            goto LAB_0015c7c0;
          }
          iVar4 = 1;
          if (pMP3->pData != (ma_uint8 *)0x0) {
            iVar5 = ma_dr_mp3dec_decode_frame
                              (&pMP3->decoder,pMP3->pData + pMP3->dataConsumed,(int)pMP3->dataSize,
                               pPCMFrames,&local_44);
            lVar8 = (long)local_44.frame_bytes;
            if (0 < lVar8) {
              pMP3->dataConsumed = pMP3->dataConsumed + lVar8;
              pMP3->dataSize = pMP3->dataSize - lVar8;
            }
            if (iVar5 == 0) {
              uVar9 = 0;
              if (local_44.frame_bytes == 0) {
                memmove(pMP3->pData,pMP3->pData + pMP3->dataConsumed,pMP3->dataSize);
                pMP3->dataConsumed = 0;
                sVar6 = pMP3->dataCapacity;
                if (sVar6 == pMP3->dataSize) {
                  pmVar7 = (ma_uint8 *)
                           ma_dr_mp3__realloc_from_callbacks
                                     (pMP3->pData,sVar6 + 0x10000,sVar6,&pMP3->allocationCallbacks);
                  if (pmVar7 == (ma_uint8 *)0x0) goto LAB_0015c910;
                  pMP3->pData = pmVar7;
                  pMP3->dataCapacity = sVar6 + 0x10000;
                }
                sVar6 = (*pMP3->onRead)(pMP3->pUserData,pMP3->pData + pMP3->dataSize,
                                        pMP3->dataCapacity - pMP3->dataSize);
                pMP3->streamCursor = pMP3->streamCursor + sVar6;
                if (sVar6 == 0) {
                  pMP3->field_0x3ea0 = pMP3->field_0x3ea0 | 1;
                  uVar9 = 0;
                  goto LAB_0015c910;
                }
                pMP3->dataSize = pMP3->dataSize + sVar6;
              }
              iVar4 = 0;
              uVar9 = 0;
            }
            else {
              bVar2 = (pMP3->decoder).header[1];
              uVar9 = 0x480 >> ((bVar2 & 0xe) == 2);
              if ((~bVar2 & 6) == 0) {
                uVar9 = 0x180;
              }
              pMP3->pcmFramesConsumedInMP3Frame = 0;
              pMP3->pcmFramesRemainingInMP3Frame = uVar9;
              pMP3->mp3FrameChannels = local_44.channels;
              pMP3->mp3FrameSampleRate = local_44.hz;
              iVar4 = 2;
            }
          }
        }
LAB_0015c910:
      } while (iVar4 == 0);
      if (iVar4 != 2) {
        uVar9 = 0;
      }
    }
  }
  else {
    uVar9 = 0;
    if ((pMP3->field_0x3ea0 & 1) == 0) {
      sVar3 = (pMP3->memory).currentReadPos;
      iVar4 = ma_dr_mp3dec_decode_frame
                        (&pMP3->decoder,pmVar7 + sVar3,(int)sVar6 - (int)sVar3,pPCMFrames,&local_44)
      ;
      if (iVar4 == 0) {
        do {
          if ((long)local_44.frame_bytes < 1) {
            uVar9 = 0;
            goto LAB_0015c6c1;
          }
          sVar6 = (long)local_44.frame_bytes + (pMP3->memory).currentReadPos;
          (pMP3->memory).currentReadPos = sVar6;
          iVar4 = ma_dr_mp3dec_decode_frame
                            (&pMP3->decoder,(pMP3->memory).pData + sVar6,
                             (int)(pMP3->memory).dataSize - (int)sVar6,pPCMFrames,&local_44);
        } while (iVar4 == 0);
      }
      bVar2 = (pMP3->decoder).header[1];
      uVar9 = 0x180;
      if ((~bVar2 & 6) != 0) {
        uVar9 = 0x480 >> ((bVar2 & 0xe) == 2);
      }
      pMP3->pcmFramesConsumedInMP3Frame = 0;
      pMP3->pcmFramesRemainingInMP3Frame = uVar9;
      pMP3->mp3FrameChannels = local_44.channels;
      pMP3->mp3FrameSampleRate = local_44.hz;
LAB_0015c6c1:
      psVar1 = &(pMP3->memory).currentReadPos;
      *psVar1 = *psVar1 + (long)local_44.frame_bytes;
    }
  }
  return uVar9;
}

Assistant:

static ma_uint32 ma_dr_mp3_decode_next_frame_ex(ma_dr_mp3* pMP3, ma_dr_mp3d_sample_t* pPCMFrames)
{
    if (pMP3->memory.pData != NULL && pMP3->memory.dataSize > 0) {
        return ma_dr_mp3_decode_next_frame_ex__memory(pMP3, pPCMFrames);
    } else {
        return ma_dr_mp3_decode_next_frame_ex__callbacks(pMP3, pPCMFrames);
    }
}